

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Logger.cpp
# Opt level: O0

void __thiscall pobr::utils::Logger::Exception::Exception(Exception *this,string *error)

{
  string *error_local;
  Exception *this_local;
  
  std::exception::exception(&this->super_exception);
  *(undefined ***)this = &PTR__Exception_00136a10;
  std::__cxx11::string::string((string *)&this->error,(string *)error);
  return;
}

Assistant:

Exception::Exception(const std::string& error) noexcept:
error(error)
{}